

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shmemory.cpp
# Opt level: O0

BOOL SHMSetInfo(SHM_INFO_ID element,SHMPTR value)

{
  void *pvVar1;
  void *pvVar2;
  SHM_FIRST_HEADER *header;
  SHMPTR value_local;
  SHM_INFO_ID element_local;
  
  if ((int)element < 3) {
    pvVar1 = (void *)pthread_self();
    pvVar2 = Volatile::operator_cast_to_void_((Volatile *)&locking_thread);
    if (pvVar1 != pvVar2) {
      fprintf(_stderr,"] %s %s:%d","SHMSetInfo",
              "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/shmemory/shmemory.cpp"
              ,0x3bc);
      fprintf(_stderr,"SHMGetInfo called while thread does not hold the SHM lock!\n");
    }
    pvVar1 = Volatile<void_*>::Load(shm_segment_bases);
    if ((PAL_InitializeChakraCoreCalled & 1U) == 0) {
      abort();
    }
    Volatile<unsigned_long>::Load
              ((Volatile<unsigned_long> *)((long)pvVar1 + (ulong)element * 8 + 0xa8));
    Volatile<unsigned_long>::operator=
              ((Volatile<unsigned_long> *)((long)pvVar1 + (ulong)element * 8 + 0xa8),value);
    value_local._4_4_ = 1;
  }
  else {
    fprintf(_stderr,"] %s %s:%d","SHMSetInfo",
            "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/shmemory/shmemory.cpp"
            ,0x3b4);
    fprintf(_stderr,"Invalid SHM info element %d\n",(ulong)element);
    value_local._4_4_ = 0;
  }
  return value_local._4_4_;
}

Assistant:

BOOL SHMSetInfo(SHM_INFO_ID element, SHMPTR value)
{
    SHM_FIRST_HEADER *header;

    if(element >= SIID_LAST)
    {
        ASSERT("Invalid SHM info element %d\n", element);
        return FALSE;
    }

    /* verify that this thread holds the SHM lock. No race condition: if the
       current thread is here, it can't be in SHMLock or SHMUnlock */
    if( (HANDLE)pthread_self() != locking_thread )
    {
        ASSERT("SHMGetInfo called while thread does not hold the SHM lock!\n");
    }

    header = (SHM_FIRST_HEADER*)shm_segment_bases[0].Load();

    TRACE("Setting SHM info element %d to %08x; used to be %08x\n",
          element, value, header->shm_info[element].Load() );

    header->shm_info[element] = value;

    return TRUE;
}